

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O2

vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_> *
__thiscall
tonk::SDKConnectionList<MyServerConnection>::GetList
          (vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
           *__return_storage_ptr__,SDKConnectionList<MyServerConnection> *this)

{
  long lVar1;
  ulong uVar2;
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->ConnectionListLock);
  uVar2 = (long)(this->ConnectionList).
                super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ConnectionList).
                super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::vector(__return_storage_ptr__,uVar2 & 0xffffffff,(allocator_type *)&local_40);
  for (lVar1 = 0; (uVar2 & 0xffffffff) << 4 != lVar1; lVar1 = lVar1 + 0x10) {
    std::static_pointer_cast<MyServerConnection,tonk::SDKConnection>
              ((shared_ptr<tonk::SDKConnection> *)&local_40);
    std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((__return_storage_ptr__->
                         super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar1),&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::shared_ptr<T> > GetList()
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);

        const unsigned count = static_cast<unsigned>(ConnectionList.size());
        std::vector< std::shared_ptr<T> > result(count);

        for (unsigned i = 0; i < count; ++i)
            result[i] = std::static_pointer_cast<T, SDKConnection>(ConnectionList[i]);

        return result;
    }